

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.h
# Opt level: O2

size_t __thiscall
Memory::RecyclerSweep::
GetHeapBlockCount<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
          (RecyclerSweep *this,
          HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
          *heapBucket)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  
  if ((heapBucket->super_HeapBucket).heapInfo != this->heapInfo) {
    return 0;
  }
  uVar1 = HeapBucket::GetBucketIndex(&heapBucket->super_HeapBucket);
  sVar2 = HeapBlockList::
          Count<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
                    ((this->finalizableWithBarrierData).bucketData[uVar1].pendingSweepList);
  sVar3 = HeapBlockList::
          Count<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
                    ((this->finalizableWithBarrierData).bucketData[uVar1].pendingEmptyBlockList);
  return sVar3 + sVar2;
}

Assistant:

size_t
RecyclerSweep::GetHeapBlockCount(HeapBucketT<TBlockType> const * heapBucket)
{
    if (heapBucket->heapInfo != this->heapInfo)
    {
        return 0;
    }
    auto& bucketData = this->GetBucketData(heapBucket);
    return HeapBlockList::Count(bucketData.pendingSweepList)
        + HeapBlockList::Count(bucketData.pendingEmptyBlockList);
}